

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pybind11.h
# Opt level: O3

void __thiscall pybind11::cpp_function::strdup_guard::~strdup_guard(strdup_guard *this)

{
  pointer ppcVar1;
  pointer ppcVar2;
  vector<char_*,_std::allocator<char_*>_> *__range2;
  
  ppcVar2 = (this->strings).super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  ppcVar1 = (this->strings).super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  if (ppcVar2 != ppcVar1) {
    do {
      free(*ppcVar2);
      ppcVar2 = ppcVar2 + 1;
    } while (ppcVar2 != ppcVar1);
    ppcVar2 = (this->strings).super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.
              super__Vector_impl_data._M_start;
  }
  if (ppcVar2 != (pointer)0x0) {
    operator_delete(ppcVar2,(long)(this->strings).
                                  super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.
                                  super__Vector_impl_data._M_end_of_storage - (long)ppcVar2);
    return;
  }
  return;
}

Assistant:

~strdup_guard() {
            for (auto s : strings)
                std::free(s);
        }